

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O2

void __thiscall
coro_io::
callback_awaitor_base<async_simple::Try<std::pair<std::error_code,unsigned_long>>,coro_io::callback_awaitor<async_simple::Try<std::pair<std::error_code,unsigned_long>>>>
::awaitor_handler::set_value<async_simple::Try<std::pair<std::error_code,unsigned_long>>>
          (awaitor_handler *this,Try<std::pair<std::error_code,_unsigned_long>_> *args)

{
  std::__detail::__variant::
  _Move_assign_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  ::operator=((_Move_assign_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
               *)(*(long *)this + 8),
              (_Move_assign_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
               *)args);
  return;
}

Assistant:

void set_value(Args &&...args) const {
      if constexpr (!std::is_void_v<Arg>) {
        obj->arg_ = {std::forward<Args>(args)...};
      }
    }